

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

void __thiscall
Minisat::IntOption::fillGranularityDomain
          (IntOption *this,int granularity,vector<int,_std::allocator<int>_> *values)

{
  reference pvVar1;
  vector<int,_std::allocator<int>_> *in_RDX;
  int in_ESI;
  vector<int,_std::allocator<int>_> *in_RDI;
  int i;
  int j;
  int dist;
  int addedValues;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  value_type vVar2;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar3;
  int iVar4;
  undefined4 in_stack_ffffffffffffffcc;
  value_type vVar5;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  std::vector<int,_std::allocator<int>_>::resize
            (in_RDI,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  vVar5 = *(value_type *)
           &in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish;
  local_1c = 1;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,0);
  *pvVar1 = vVar5;
  if (*(int *)&in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish < 0x10) {
    iVar3 = 1;
  }
  else {
    iVar3 = 0x200;
    if (*(int *)&in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish < 16000) {
      iVar3 = 0x40;
    }
  }
  iVar4 = iVar3;
  if (1 < in_ESI) {
    vVar2 = *(value_type *)
             ((long)&in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 4);
    local_1c = 2;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,1);
    *pvVar1 = vVar2;
  }
  do {
    local_20 = iVar3;
    if (in_ESI <= local_1c) break;
    if ((*(int *)&in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish <
         *(int *)&in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + local_20) &&
       (*(int *)&in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish + local_20 <=
        *(int *)((long)&in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + 4))) {
      iVar3 = *(int *)&in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)local_1c);
      *pvVar1 = iVar3 + local_20;
      local_1c = local_1c + 1;
    }
    if ((local_1c < in_ESI) &&
       (*(int *)&in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start <=
        *(int *)&in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish - local_20)) {
      iVar3 = *(int *)&in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)local_1c);
      *pvVar1 = iVar3 - local_20;
      local_1c = local_1c + 1;
    }
    iVar3 = local_20 * 4;
  } while (((*(int *)&in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish <=
             *(int *)&in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + local_20 * -4) ||
           (*(int *)&in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + iVar3 <=
            *(int *)((long)&in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 4))) ||
          (*(int *)&in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start <=
           *(int *)&in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + local_20 * -4));
  std::vector<int,_std::allocator<int>_>::resize(in_RDI,CONCAT44(vVar5,iVar4));
  sort<int>((vector<int,_std::allocator<int>_> *)
            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  local_24 = 0;
  for (local_28 = 1; local_28 < local_1c; local_28 = local_28 + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)local_28);
    iVar3 = *pvVar1;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)local_24);
    if (iVar3 != *pvVar1) {
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)local_28);
      vVar2 = *pvVar1;
      local_24 = local_24 + 1;
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)local_24);
      *pvVar1 = vVar2;
    }
  }
  std::vector<int,_std::allocator<int>_>::resize(in_RDI,CONCAT44(vVar5,iVar4));
  return;
}

Assistant:

void fillGranularityDomain(int granularity, std::vector<int> &values)
    {
        values.resize(granularity);
        int addedValues = 0;
        values[addedValues++] = value;
        int dist = value < 16 ? 1 : (value < 16000 ? 64 : 512); // smarter way to initialize the initial diff value
        if (addedValues < granularity) {
            values[addedValues++] = defaultValue;
        }
        while (addedValues < granularity) {
            if (value + dist > value && value + dist <= range.end) {
                values[addedValues++] = value + dist;
            }
            if (addedValues < granularity && value - dist >= range.begin) {
                values[addedValues++] = value - dist;
            }
            dist = dist * 4;
            if (value - dist < value && value + dist > range.end && value - dist < range.begin) {
                break;
            } // stop if there cannot be more values!
        }
        values.resize(addedValues);
        sort(values);
        int j = 0;
        assert(values[0] >= range.begin && values[0] <= range.end && "stay in bound");
        for (int i = 1; i < addedValues; ++i) {
            if (values[i] != values[j]) {
                assert(values[i] >= range.begin && values[i] <= range.end && "stay in bound");
                values[++j] = values[i];
            }
        }
        j++;
        assert(addedValues > 0 && "there has to be at least one option");
        assert(j <= addedValues && j <= granularity && "collected values hae to stay in bounds");
        values.resize(j);
    }